

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::DataManReader::DoClose(DataManReader *this,int transportIndex)

{
  string *filename;
  
  LOCK();
  (this->m_SubscriberThreadActive)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->m_RequesterThreadActive)._M_base._M_i = false;
  UNLOCK();
  if ((this->m_SubscriberThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->m_RequesterThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  (this->super_Engine).m_IsClosed = true;
  if (this->m_MonitorActive == true) {
    filename = &(this->super_Engine).m_Name;
    DataManMonitor::OutputCsv(&this->m_Monitor,filename);
    DataManMonitor::OutputJson(&this->m_Monitor,filename);
    return;
  }
  return;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}